

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O2

void __thiscall
glcts::GPUShader5ImagesArrayIndexing::GPUShader5ImagesArrayIndexing
          (GPUShader5ImagesArrayIndexing *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_01e015f8;
  this->m_compute_shader_id = 0;
  this->m_to_ids = (GLuint *)0x0;
  this->m_fbo_id = 0;
  this->m_data_buffer = (GLuint *)0x0;
  this->m_program_id = 0;
  this->m_texture_height = 0;
  this->m_texture_width = 0;
  return;
}

Assistant:

GPUShader5ImagesArrayIndexing::GPUShader5ImagesArrayIndexing(Context& context, const ExtParameters& extParams,
															 const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_compute_shader_id(0)
	, m_data_buffer(DE_NULL)
	, m_program_id(0)
	, m_texture_height(0)
	, m_texture_width(0)
	, m_to_ids(DE_NULL)
	, m_fbo_id(0)
{
	/* Nothing to be done here */
}